

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::objectivec::FilePath_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FileDescriptor *file)

{
  string *directory_00;
  undefined1 in_R8B;
  undefined7 in_register_00000081;
  string_view filename;
  string_view input;
  string_view path;
  string basename;
  string directory;
  string output;
  string local_110;
  string *local_f0;
  pointer local_e8;
  undefined1 local_e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  undefined1 local_c0;
  undefined7 uStack_bf;
  undefined1 local_b0 [48];
  undefined1 local_80 [32];
  undefined8 local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  
  local_d0._8_8_ = 0;
  local_c0 = 0;
  local_110._M_string_length = 0;
  local_110.field_2._M_local_buf[0] = '\0';
  local_e8 = (pointer)0x0;
  local_e0[0] = 0;
  directory_00 = &local_110;
  path._M_str = (char *)&local_f0;
  path._M_len = **(size_t **)(this + 8);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  local_f0 = (string *)local_e0;
  local_d0._M_allocated_capacity = (size_type)&local_c0;
  anon_unknown_0::PathSplit
            ((anon_unknown_0 *)(*(size_t **)(this + 8))[1],path,directory_00,
             (string *)CONCAT71(in_register_00000081,in_R8B));
  if (local_e8 != (pointer)0x0) {
    local_b0._0_8_ = local_e8;
    local_b0._8_8_ = local_f0;
    local_60._0_1_ = '\x01';
    local_60._1_1_ = '\0';
    local_60._2_1_ = '\0';
    local_60._3_1_ = '\0';
    local_60._4_1_ = '\0';
    local_60._5_1_ = '\0';
    local_60._6_1_ = '\0';
    local_60._7_1_ = '\0';
    local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x3ed8b0;
    directory_00 = local_f0;
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_80,(AlphaNum *)local_b0);
    std::__cxx11::string::operator=((string *)(local_e0 + 0x10),(string *)local_80);
    if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
      operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
    }
  }
  filename._M_str = (char *)directory_00;
  filename._M_len = (size_t)local_110._M_dataplus._M_p;
  StripProto_abi_cxx11_((string *)local_b0,(compiler *)local_110._M_string_length,filename);
  std::__cxx11::string::operator=((string *)&local_110,(string *)local_b0);
  if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  input._M_str = (char *)0x1;
  input._M_len = (size_t)local_110._M_dataplus._M_p;
  (anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
            ((string *)local_b0,(_anonymous_namespace_ *)local_110._M_string_length,input,
             (bool)in_R8B);
  std::__cxx11::string::operator=((string *)&local_110,(string *)local_b0);
  if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  local_b0._0_8_ = local_d0._8_8_;
  local_b0._8_8_ = local_d0._M_allocated_capacity;
  local_60 = (_anonymous_namespace_ *)local_110._M_string_length;
  local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_110._M_dataplus._M_p;
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,(AlphaNum *)local_b0);
  if (local_f0 != (string *)local_e0) {
    operator_delete(local_f0,CONCAT71(local_e0._1_7_,local_e0[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,
                    CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                             local_110.field_2._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_d0._M_allocated_capacity != &local_c0) {
    operator_delete((void *)local_d0._M_allocated_capacity,CONCAT71(uStack_bf,local_c0) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FilePath(const FileDescriptor* file) {
  std::string output;
  std::string basename;
  std::string directory;
  PathSplit(file->name(), &directory, &basename);
  if (!directory.empty()) {
    output = absl::StrCat(directory, "/");
  }
  basename = StripProto(basename);

  // CamelCase to be more ObjC friendly.
  basename = UnderscoresToCamelCase(basename, true);

  return absl::StrCat(output, basename);
}